

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
::find<google::protobuf::Symbol>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
           *this,key_arg<google::protobuf::Symbol> *key)

{
  ctrl_t *pcVar1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
  *this_00;
  ctrl_t *pcVar2;
  void *pvVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  bool bVar22;
  ushort uVar23;
  Symbol *key_1;
  uint64_t uVar24;
  slot_type *this_01;
  anon_union_8_1_a8a14541_for_iterator_2 aVar25;
  Symbol *b;
  Symbol *b_00;
  ulong extraout_RDX;
  ulong uVar26;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
  *prVar27;
  ulong i;
  undefined1 uVar28;
  uint uVar29;
  ulong uVar30;
  size_t cap_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i match;
  undefined1 auVar37 [16];
  string_view sVar38;
  iterator iVar39;
  undefined1 auVar40 [16];
  ctrl_t cVar31;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  
  AssertOnFind<google::protobuf::Symbol>(this,key);
  prVar27 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             *)(this->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
  if (prVar27 ==
      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
       *)0x1) {
    prVar27 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               *)0x1;
    if (1 < (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_) {
      this_01 = soo_slot(this);
      bVar22 = google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
                         (this_01,key,b_00);
      if (bVar22) {
        aVar25.slot_ = soo_slot(this);
        auVar32._0_8_ = kSooControl;
        auVar32._8_8_ = aVar25;
        return (iterator)auVar32;
      }
      prVar27 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 *)(this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_;
    }
LAB_00176776:
    AssertNotDebugCapacity(prVar27);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = extraout_RDX;
    return (iterator)(auVar5 << 0x40);
  }
  if (prVar27 !=
      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
       *)0x0) {
    prefetch_heap_block(prVar27);
    sVar38 = google::protobuf::Symbol::full_name(key);
    uVar24 = hash_internal::MixingHashState::CombineContiguousImpl
                       (&hash_internal::MixingHashState::kSeed,sVar38._M_str,sVar38._M_len);
    this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               *)(this->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
    if (this_00 ==
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
         *)0x1) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                   );
    }
    if (this_00 !=
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
         *)0x0) {
      if (((ulong)((long)&(this_00->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_ + 1U) & (ulong)this_00) != 0) {
        __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x14c,
                      "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                     );
      }
      uVar30 = (uVar24 ^ sVar38._M_len) * -0x234dd359734ecb13;
      pcVar2 = (this->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.control;
      uVar26 = (uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 | (uVar30 & 0xff00) << 0x28
               | uVar30 << 0x38) >> 7 ^ (ulong)pcVar2 >> 0xc;
      control(this_00);
      uVar28 = (undefined1)(uVar30 >> 0x38);
      auVar32 = ZEXT216(CONCAT11(uVar28,uVar28) & 0x7f7f);
      auVar32 = pshuflw(auVar32,auVar32,0);
      uVar30 = 0;
      while( true ) {
        uVar26 = uVar26 & (ulong)this_00;
        pcVar1 = pcVar2 + uVar26;
        cVar6 = *pcVar1;
        cVar7 = pcVar1[1];
        cVar8 = pcVar1[2];
        cVar9 = pcVar1[3];
        cVar10 = pcVar1[4];
        cVar11 = pcVar1[5];
        cVar12 = pcVar1[6];
        cVar13 = pcVar1[7];
        cVar14 = pcVar1[8];
        cVar15 = pcVar1[9];
        cVar16 = pcVar1[10];
        cVar17 = pcVar1[0xb];
        cVar18 = pcVar1[0xc];
        cVar19 = pcVar1[0xd];
        cVar20 = pcVar1[0xe];
        cVar21 = pcVar1[0xf];
        cVar31 = auVar32[0];
        auVar33[0] = -(cVar31 == cVar6);
        cVar34 = auVar32[1];
        auVar33[1] = -(cVar34 == cVar7);
        cVar35 = auVar32[2];
        auVar33[2] = -(cVar35 == cVar8);
        cVar36 = auVar32[3];
        auVar33[3] = -(cVar36 == cVar9);
        auVar33[4] = -(cVar31 == cVar10);
        auVar33[5] = -(cVar34 == cVar11);
        auVar33[6] = -(cVar35 == cVar12);
        auVar33[7] = -(cVar36 == cVar13);
        auVar33[8] = -(cVar31 == cVar14);
        auVar33[9] = -(cVar34 == cVar15);
        auVar33[10] = -(cVar35 == cVar16);
        auVar33[0xb] = -(cVar36 == cVar17);
        auVar33[0xc] = -(cVar31 == cVar18);
        auVar33[0xd] = -(cVar34 == cVar19);
        auVar33[0xe] = -(cVar35 == cVar20);
        auVar33[0xf] = -(cVar36 == cVar21);
        uVar23 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf
        ;
        uVar29 = (uint)uVar23;
        while (uVar23 != 0) {
          uVar4 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          i = uVar4 + uVar26 & (ulong)this_00;
          pvVar3 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.slot_array.p;
          slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                      *)(this->settings_).
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_);
          bVar22 = google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
                             ((void *)(i * 8 + (long)pvVar3),key,b);
          if (bVar22) {
            iVar39 = iterator_at(this,i);
            auVar40._0_8_ = iVar39.ctrl_;
            auVar40._8_8_ = iVar39.field_1;
            return (iterator)auVar40;
          }
          uVar23 = (ushort)(uVar29 - 1) & (ushort)uVar29;
          uVar29 = CONCAT22((short)(uVar29 - 1 >> 0x10),uVar23);
        }
        auVar37[0] = -(cVar6 == kEmpty);
        auVar37[1] = -(cVar7 == kEmpty);
        auVar37[2] = -(cVar8 == kEmpty);
        auVar37[3] = -(cVar9 == kEmpty);
        auVar37[4] = -(cVar10 == kEmpty);
        auVar37[5] = -(cVar11 == kEmpty);
        auVar37[6] = -(cVar12 == kEmpty);
        auVar37[7] = -(cVar13 == kEmpty);
        auVar37[8] = -(cVar14 == kEmpty);
        auVar37[9] = -(cVar15 == kEmpty);
        auVar37[10] = -(cVar16 == kEmpty);
        auVar37[0xb] = -(cVar17 == kEmpty);
        auVar37[0xc] = -(cVar18 == kEmpty);
        auVar37[0xd] = -(cVar19 == kEmpty);
        auVar37[0xe] = -(cVar20 == kEmpty);
        auVar37[0xf] = -(cVar21 == kEmpty);
        prVar27 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   *)(this->settings_).
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.capacity_;
        if ((((((((((((((((auVar37 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar37 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar37 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar37 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar37 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar37 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar37 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar37 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar37 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar37 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar37 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar37 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar21 == kEmpty)
        break;
        if (prVar27 ==
            (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             *)0x0) goto LAB_0017678c;
        uVar26 = uVar30 + uVar26 + 0x10;
        uVar30 = uVar30 + 0x10;
        if (prVar27 < uVar30) {
          __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xe37,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                       );
        }
      }
      goto LAB_00176776;
    }
  }
LAB_0017678c:
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
               );
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }